

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall gl3cts::TransformFeedback::DrawXFBStream::clean(DrawXFBStream *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  long lVar5;
  bool bVar6;
  long lVar4;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(0);
  if (this->m_program_id_generate != 0) {
    (**(code **)(lVar4 + 0x448))();
    this->m_program_id_generate = 0;
  }
  if (this->m_program_id_draw != 0) {
    uVar3 = (**(code **)(lVar4 + 0x780))(this->m_program_id_draw,"position");
    (**(code **)(lVar4 + 0x518))(uVar3);
    (**(code **)(lVar4 + 0x448))(this->m_program_id_draw);
    this->m_program_id_draw = 0;
  }
  if (this->m_xfb_id != 0) {
    (**(code **)(lVar4 + 0x488))(1,&this->m_xfb_id);
    this->m_xfb_id = 0;
  }
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    if (this->m_bo_id[lVar5] != 0) {
      (**(code **)(lVar4 + 0x438))(1,this->m_bo_id + lVar5);
      this->m_bo_id[lVar5] = 0;
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  if (this->m_vao_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBStream::clean()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (m_program_id_generate)
	{
		gl.deleteProgram(m_program_id_generate);

		m_program_id_generate = 0;
	}

	if (m_program_id_draw)
	{
		glw::GLuint position_location = gl.getAttribLocation(m_program_id_draw, "position");

		gl.disableVertexAttribArray(position_location);

		gl.deleteProgram(m_program_id_draw);

		m_program_id_draw = 0;
	}

	if (m_xfb_id)
	{
		gl.deleteTransformFeedbacks(1, &m_xfb_id);

		m_xfb_id = 0;
	}

	for (glw::GLuint i = 0; i < s_bo_ids_count; ++i)
	{
		if (m_bo_id[i])
		{
			gl.deleteBuffers(1, &m_bo_id[i]);

			m_bo_id[i] = 0;
		}
	}

	if (m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}